

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O0

void __thiscall
Buffer_change_event_add_readonly_Test::TestBody(Buffer_change_event_add_readonly_Test *this)

{
  initializer_list<bfy_changed_cb_info> __l;
  bool bVar1;
  size_t sVar2;
  const_pointer data;
  char *message;
  AssertHelper local_180;
  Message local_178;
  allocator<bfy_changed_cb_info> local_169;
  bfy_changed_cb_info local_168;
  iterator local_150;
  size_type local_148;
  vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_> local_140;
  undefined1 local_128 [8];
  AssertionResult gtest_ar;
  bfy_changed_cb_info expected;
  size_type size;
  string_view str;
  undefined1 local_d0 [8];
  BufferWithReadonlyStrings local;
  Buffer_change_event_add_readonly_Test *this_local;
  
  local.changes.super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::BufferWithReadonlyStrings
            ((BufferWithReadonlyStrings *)local_d0);
  size = 0x1a;
  str._M_len = (size_t)anon_var_dwarf_11aa1;
  sVar2 = bfy_buffer_get_content_len((bfy_buffer *)local_d0);
  anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::start_listening_to_changes
            ((BufferWithReadonlyStrings *)local_d0);
  data = std::data<std::basic_string_view<char,std::char_traits<char>>>
                   ((basic_string_view<char,_std::char_traits<char>_> *)&size);
  bfy_buffer_add_readonly((bfy_buffer *)local_d0,data,0x1a);
  local_168.n_deleted = 0;
  local_168.n_added = 0x1a;
  local_150 = &local_168;
  local_148 = 1;
  local_168.orig_size = sVar2;
  std::allocator<bfy_changed_cb_info>::allocator(&local_169);
  __l._M_len = local_148;
  __l._M_array = local_150;
  std::vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>::vector
            (&local_140,__l,&local_169);
  testing::internal::EqHelper::
  Compare<std::vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>,_std::vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>,_nullptr>
            ((EqHelper *)local_128,"changes_t{expected}","local.changes",&local_140,
             (vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_> *)
             ((long)&local.allstrs.field_2 + 8));
  std::vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>::~vector(&local_140);
  std::allocator<bfy_changed_cb_info>::~allocator(&local_169);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x5bd,message);
    testing::internal::AssertHelper::operator=(&local_180,&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::~BufferWithReadonlyStrings
            ((BufferWithReadonlyStrings *)local_d0);
  return;
}

Assistant:

TEST(Buffer, change_event_add_readonly) {
    BufferWithReadonlyStrings local;
    auto constexpr str = std::string_view { "Lorem ipsum dolor sit amet" };
    auto constexpr size = std::size(str);
    auto const expected = bfy_changed_cb_info {
        .orig_size = bfy_buffer_get_content_len(&local.buf),
        .n_added = size,
        .n_deleted = 0
    };

    local.start_listening_to_changes();
    bfy_buffer_add_readonly(&local.buf, std::data(str), size);
    EXPECT_EQ(changes_t{expected}, local.changes);
}